

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerHLSL::emit_store(CompilerHLSL *this,Instruction *instruction)

{
  uint32_t *puVar1;
  SPIRAccessChain *chain;
  SmallVector<unsigned_int,_8UL> local_50;
  
  puVar1 = Compiler::stream((Compiler *)this,instruction);
  chain = Compiler::maybe_get<spirv_cross::SPIRAccessChain>((Compiler *)this,*puVar1);
  if (chain != (SPIRAccessChain *)0x0) {
    local_50.super_VectorView<unsigned_int>.ptr = (uint *)&local_50.stack_storage;
    local_50.super_VectorView<unsigned_int>.buffer_size = 0;
    local_50.buffer_capacity = 8;
    write_access_chain(this,chain,puVar1[1],&local_50);
    SmallVector<unsigned_int,_8UL>::~SmallVector(&local_50);
    return;
  }
  CompilerGLSL::emit_instruction(&this->super_CompilerGLSL,instruction);
  return;
}

Assistant:

void CompilerHLSL::emit_store(const Instruction &instruction)
{
	auto ops = stream(instruction);
	auto *chain = maybe_get<SPIRAccessChain>(ops[0]);
	if (chain)
		write_access_chain(*chain, ops[1], {});
	else
		CompilerGLSL::emit_instruction(instruction);
}